

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::Semaphore>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  long *plVar1;
  Handle<(vk::HandleType)4> HVar2;
  VkAllocationCallbacks *allocator;
  DeviceInterface *vk;
  VkDevice device;
  size_t sVar3;
  size_t sVar4;
  char *__s;
  size_t sVar5;
  deUint64 *pdVar6;
  long *plVar7;
  int *piVar8;
  long lVar9;
  size_type __n;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  objects;
  AllocationCallbackRecorder allocRecorder;
  VkSemaphore local_218;
  undefined1 auStack_210 [8];
  VkDevice local_208;
  VkAllocationCallbacks *pVStack_200;
  VkDevice local_1f8;
  DeviceInterface *local_1f0;
  Move<vk::Handle<(vk::HandleType)4>_> local_1e8;
  undefined1 local_1c8 [8];
  VkAllocationCallbacks aVStack_1c0 [2];
  ios_base local_150 [264];
  VkSemaphoreCreateInfo local_48;
  
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1c8,allocator,0x400);
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  Context::getUniversalQueueFamilyIndex(context);
  sVar3 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1c8);
  local_48.sType = VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO;
  local_48.pNext = (void *)0x0;
  local_48.flags = params.flags;
  ::vk::createSemaphore(&local_1e8,vk,device,&local_48,aVStack_1c0);
  local_218.m_internal =
       local_1e8.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal;
  auStack_210 = (undefined1  [8])
                local_1e8.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_deviceIface
  ;
  local_208 = local_1e8.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_device;
  pVStack_200 = local_1e8.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator;
  sVar4 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1c8);
  if (local_218.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)4>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)4>_> *)auStack_210,local_218);
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1c8);
  sVar3 = getSafeObjectCount((Context *)context->m_testCtx->m_platform,sVar4 - sVar3,0);
  __n = 100;
  if (sVar3 < 100) {
    __n = sVar3;
  }
  local_1f0 = Context::getDeviceInterface(context);
  local_1f8 = Context::getDevice(context);
  Context::getUniversalQueueFamilyIndex(context);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
            *)&local_1e8,__n,(allocator_type *)local_1c8);
  local_1c8 = (undefined1  [8])context->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)aVStack_1c0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aVStack_1c0,"Creating ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)aVStack_1c0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aVStack_1c0," ",1);
  __s = ::vk::getTypeName<vk::Handle<(vk::HandleType)4>>();
  if (__s == (char *)0x0) {
    std::ios::clear((int)aVStack_1c0 +
                    (int)((DeviceInterface *)((long)aVStack_1c0[0].pUserData + -0x18))->
                         _vptr_DeviceInterface);
  }
  else {
    sVar5 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aVStack_1c0,__s,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aVStack_1c0," objects",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)aVStack_1c0);
  std::ios_base::~ios_base(local_150);
  if (sVar3 != 0) {
    lVar9 = 0;
    do {
      pdVar6 = (deUint64 *)operator_new(0x20);
      local_218.m_internal._0_4_ = 9;
      auStack_210 = (undefined1  [8])0x0;
      local_208 = (VkDevice)CONCAT44(local_208._4_4_,params.flags);
      ::vk::createSemaphore
                ((Move<vk::Handle<(vk::HandleType)4>_> *)local_1c8,local_1f0,local_1f8,
                 (VkSemaphoreCreateInfo *)&local_218,(VkAllocationCallbacks *)0x0);
      pdVar6[2] = (deUint64)aVStack_1c0[0].pfnAllocation;
      pdVar6[3] = (deUint64)aVStack_1c0[0].pfnReallocation;
      *pdVar6 = (deUint64)local_1c8;
      pdVar6[1] = (deUint64)aVStack_1c0[0].pUserData;
      local_1c8 = (undefined1  [8])0x0;
      aVStack_1c0[0].pUserData = (DeviceInterface *)0x0;
      aVStack_1c0[0].pfnAllocation = (PFN_vkAllocationFunction)0x0;
      aVStack_1c0[0].pfnReallocation = (PFN_vkReallocationFunction)0x0;
      plVar7 = (long *)operator_new(0x20);
      HVar2.m_internal =
           local_1e8.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal;
      *(undefined4 *)(plVar7 + 1) = 0;
      *(undefined4 *)((long)plVar7 + 0xc) = 0;
      *plVar7 = (long)&PTR__SharedPtrState_00cef1f0;
      plVar7[2] = (long)pdVar6;
      *(undefined4 *)(plVar7 + 1) = 1;
      *(undefined4 *)((long)plVar7 + 0xc) = 1;
      plVar1 = *(long **)((long)(local_1e8.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.
                                 object.m_internal + 8) + lVar9);
      if (plVar1 != plVar7) {
        if (plVar1 != (long *)0x0) {
          LOCK();
          plVar1 = plVar1 + 1;
          *(int *)plVar1 = (int)*plVar1 + -1;
          UNLOCK();
          if ((int)*plVar1 == 0) {
            *(undefined8 *)
             (local_1e8.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.m_internal +
             lVar9) = 0;
            (**(code **)(**(long **)((long)(local_1e8.super_RefBase<vk::Handle<(vk::HandleType)4>_>.
                                            m_data.object.m_internal + 8) + lVar9) + 0x10))();
          }
          LOCK();
          piVar8 = (int *)(*(long *)((long)(HVar2.m_internal + 8) + lVar9) + 0xc);
          *piVar8 = *piVar8 + -1;
          UNLOCK();
          if (*piVar8 == 0) {
            plVar1 = *(long **)((long)(HVar2.m_internal + 8) + lVar9);
            if (plVar1 != (long *)0x0) {
              (**(code **)(*plVar1 + 8))();
            }
            *(undefined8 *)((long)(HVar2.m_internal + 8) + lVar9) = 0;
          }
        }
        *(deUint64 **)(HVar2.m_internal + lVar9) = pdVar6;
        *(long **)((long)(HVar2.m_internal + 8) + lVar9) = plVar7;
        LOCK();
        *(int *)(plVar7 + 1) = (int)plVar7[1] + 1;
        UNLOCK();
        LOCK();
        piVar8 = (int *)(*(long *)((long)(HVar2.m_internal + 8) + lVar9) + 0xc);
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      plVar1 = plVar7 + 1;
      LOCK();
      *(int *)plVar1 = (int)*plVar1 + -1;
      UNLOCK();
      if ((int)*plVar1 == 0) {
        (**(code **)(*plVar7 + 0x10))(plVar7);
      }
      piVar8 = (int *)((long)plVar7 + 0xc);
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        (**(code **)(*plVar7 + 8))(plVar7);
      }
      if (local_1c8 != (undefined1  [8])0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)4>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)4>_> *)aVStack_1c0,(VkSemaphore)local_1c8);
      }
      lVar9 = lVar9 + 0x10;
    } while (__n << 4 != lVar9);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  ::_M_erase_at_end((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                     *)&local_1e8,
                    (pointer)local_1e8.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.object.
                             m_internal);
  local_1c8 = (undefined1  [8])&aVStack_1c0[0].pfnAllocation;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_1c8,
             (undefined1 *)((long)(_func_int ***)aVStack_1c0[0].pUserData + (long)local_1c8));
  if (local_1c8 != (undefined1  [8])&aVStack_1c0[0].pfnAllocation) {
    operator_delete((void *)local_1c8,(ulong)(aVStack_1c0[0].pfnAllocation + 1));
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
             *)&local_1e8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}